

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O2

MOJOSHADER_effectTechnique *
MOJOSHADER_effectFindNextValidTechnique
          (MOJOSHADER_effect *effect,MOJOSHADER_effectTechnique *technique)

{
  long lVar1;
  MOJOSHADER_effectTechnique *pMVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  if (technique == (MOJOSHADER_effectTechnique *)0x0) {
    return effect->techniques;
  }
  uVar3 = effect->technique_count;
  lVar1 = 0;
  uVar4 = 0;
  if (0 < (int)uVar3) {
    uVar4 = (ulong)uVar3;
  }
  lVar5 = -0x28;
  while( true ) {
    uVar3 = uVar3 - 1;
    if (uVar4 * 0x28 + lVar5 == -0x28) {
      __assert_fail("0 && \"Technique is not part of this effect!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                    ,0x6bd,
                    "const MOJOSHADER_effectTechnique *MOJOSHADER_effectFindNextValidTechnique(const MOJOSHADER_effect *, const MOJOSHADER_effectTechnique *)"
                   );
    }
    if ((MOJOSHADER_effectTechnique *)((long)&effect->techniques->name + lVar1) == technique) break;
    lVar5 = lVar5 + -0x28;
    lVar1 = lVar1 + 0x28;
  }
  pMVar2 = (MOJOSHADER_effectTechnique *)0x0;
  if (uVar3 != 0) {
    pMVar2 = (MOJOSHADER_effectTechnique *)((long)effect->techniques - lVar5);
  }
  return pMVar2;
}

Assistant:

const MOJOSHADER_effectTechnique *MOJOSHADER_effectFindNextValidTechnique(const MOJOSHADER_effect *effect,
                                                                          const MOJOSHADER_effectTechnique *technique
)
{
    int i;
    if (technique == NULL)
        return &effect->techniques[0];
    for (i = 0; i < effect->technique_count; i++)
    {
        if (technique == &effect->techniques[i])
        {
            if (i == effect->technique_count - 1)
                return NULL; /* We were passed the last technique! */
            return &effect->techniques[i + 1];
        } // if
    } // for
    assert(0 && "Technique is not part of this effect!");
}